

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellReissner4::GetStateBlock
          (ChElementShellReissner4 *this,ChVectorDynamic<> *mD)

{
  element_type *peVar1;
  void *pvVar2;
  undefined8 *puVar3;
  Index index;
  double *pdVar4;
  ulong uVar5;
  ulong uVar6;
  
  if ((mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows != 0x1c)
  {
    pdVar4 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    if (pdVar4 != (double *)0x0) {
      free((void *)pdVar4[-1]);
    }
    pvVar2 = malloc(0x120);
    if (pvVar2 == (void *)0x0) {
      pdVar4 = (double *)0x0;
    }
    else {
      *(void **)(((ulong)pvVar2 & 0xffffffffffffffc0) + 0x38) = pvVar2;
      pdVar4 = (double *)(((ulong)pvVar2 & 0xffffffffffffffc0) + 0x40);
    }
    if (pdVar4 == (double *)0x0) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = std::ostream::_M_insert<bool>;
      __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data = pdVar4;
  }
  (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = 0x1c;
  pdVar4 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  uVar5 = 3;
  if ((((ulong)pdVar4 & 7) == 0) &&
     (uVar6 = (ulong)(-((uint)((ulong)pdVar4 >> 3) & 0x1fffffff) & 7), uVar6 < 3)) {
    uVar5 = uVar6;
  }
  peVar1 = (((this->m_nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (uVar5 != 0) {
    uVar6 = 0;
    do {
      pdVar4[uVar6] = *(double *)((long)&peVar1->super_ChNodeFEAbase + uVar6 * 8 + 0x20);
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
  }
  if (uVar5 < 3) {
    do {
      pdVar4[uVar5] = *(double *)((long)&peVar1->super_ChNodeFEAbase + uVar5 * 8 + 0x20);
      uVar5 = uVar5 + 1;
    } while (uVar5 != 3);
  }
  if (6 < (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
    pdVar4 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data +
             3;
    uVar5 = 4;
    if ((((ulong)pdVar4 & 7) == 0) &&
       (uVar6 = (ulong)(-((uint)((ulong)pdVar4 >> 3) & 0x1fffffff) & 7), uVar6 < 4)) {
      uVar5 = uVar6;
    }
    peVar1 = (((this->m_nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (uVar5 != 0) {
      uVar6 = 0;
      do {
        pdVar4[uVar6] = *(double *)((long)&peVar1->field_0x38 + uVar6 * 8);
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
    }
    if (uVar5 < 4) {
      do {
        pdVar4[uVar5] = *(double *)((long)&peVar1->field_0x38 + uVar5 * 8);
        uVar5 = uVar5 + 1;
      } while (uVar5 != 4);
    }
    if (9 < (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
      pdVar4 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               + 7;
      uVar5 = 3;
      if ((((ulong)pdVar4 & 7) == 0) &&
         (uVar6 = (ulong)(-((uint)((ulong)pdVar4 >> 3) & 0x1fffffff) & 7), uVar6 < 3)) {
        uVar5 = uVar6;
      }
      peVar1 = (this->m_nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].
               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (uVar5 != 0) {
        uVar6 = 0;
        do {
          pdVar4[uVar6] = *(double *)((long)&peVar1->super_ChNodeFEAbase + uVar6 * 8 + 0x20);
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
      }
      if (uVar5 < 3) {
        do {
          pdVar4[uVar5] = *(double *)((long)&peVar1->super_ChNodeFEAbase + uVar5 * 8 + 0x20);
          uVar5 = uVar5 + 1;
        } while (uVar5 != 3);
      }
      if (0xd < (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows) {
        pdVar4 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data + 10;
        uVar5 = 4;
        if ((((ulong)pdVar4 & 7) == 0) &&
           (uVar6 = (ulong)(-((uint)((ulong)pdVar4 >> 3) & 0x1fffffff) & 7), uVar6 < 4)) {
          uVar5 = uVar6;
        }
        peVar1 = (this->m_nodes).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1].
                 super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        if (uVar5 != 0) {
          uVar6 = 0;
          do {
            pdVar4[uVar6] = *(double *)((long)&peVar1->field_0x38 + uVar6 * 8);
            uVar6 = uVar6 + 1;
          } while (uVar5 != uVar6);
        }
        if (uVar5 < 4) {
          do {
            pdVar4[uVar5] = *(double *)((long)&peVar1->field_0x38 + uVar5 * 8);
            uVar5 = uVar5 + 1;
          } while (uVar5 != 4);
        }
        if (0x10 < (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_rows) {
          pdVar4 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data + 0xe;
          uVar5 = 3;
          if ((((ulong)pdVar4 & 7) == 0) &&
             (uVar6 = (ulong)(-((uint)((ulong)pdVar4 >> 3) & 0x1fffffff) & 7), uVar6 < 3)) {
            uVar5 = uVar6;
          }
          peVar1 = (this->m_nodes).
                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[2].
                   super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          if (uVar5 != 0) {
            uVar6 = 0;
            do {
              pdVar4[uVar6] = *(double *)((long)&peVar1->super_ChNodeFEAbase + uVar6 * 8 + 0x20);
              uVar6 = uVar6 + 1;
            } while (uVar5 != uVar6);
          }
          if (uVar5 < 3) {
            do {
              pdVar4[uVar5] = *(double *)((long)&peVar1->super_ChNodeFEAbase + uVar5 * 8 + 0x20);
              uVar5 = uVar5 + 1;
            } while (uVar5 != 3);
          }
          if (0x14 < (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                     m_rows) {
            pdVar4 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                     m_data + 0x11;
            uVar5 = 4;
            if ((((ulong)pdVar4 & 7) == 0) &&
               (uVar6 = (ulong)(-((uint)((ulong)pdVar4 >> 3) & 0x1fffffff) & 7), uVar6 < 4)) {
              uVar5 = uVar6;
            }
            peVar1 = (this->m_nodes).
                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[2].
                     super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            if (uVar5 != 0) {
              uVar6 = 0;
              do {
                pdVar4[uVar6] = *(double *)((long)&peVar1->field_0x38 + uVar6 * 8);
                uVar6 = uVar6 + 1;
              } while (uVar5 != uVar6);
            }
            if (uVar5 < 4) {
              do {
                pdVar4[uVar5] = *(double *)((long)&peVar1->field_0x38 + uVar5 * 8);
                uVar5 = uVar5 + 1;
              } while (uVar5 != 4);
            }
            if (0x17 < (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_rows) {
              pdVar4 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_data + 0x15;
              uVar5 = 3;
              if ((((ulong)pdVar4 & 7) == 0) &&
                 (uVar6 = (ulong)(-((uint)((ulong)pdVar4 >> 3) & 0x1fffffff) & 7), uVar6 < 3)) {
                uVar5 = uVar6;
              }
              peVar1 = (this->m_nodes).
                       super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[3].
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              if (uVar5 != 0) {
                uVar6 = 0;
                do {
                  pdVar4[uVar6] = *(double *)((long)&peVar1->super_ChNodeFEAbase + uVar6 * 8 + 0x20)
                  ;
                  uVar6 = uVar6 + 1;
                } while (uVar5 != uVar6);
              }
              if (uVar5 < 3) {
                do {
                  pdVar4[uVar5] = *(double *)((long)&peVar1->super_ChNodeFEAbase + uVar5 * 8 + 0x20)
                  ;
                  uVar5 = uVar5 + 1;
                } while (uVar5 != 3);
              }
              if (0x1b < (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_rows) {
                pdVar4 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_data + 0x18;
                uVar5 = 4;
                if ((((ulong)pdVar4 & 7) == 0) &&
                   (uVar6 = (ulong)(-((uint)((ulong)pdVar4 >> 3) & 0x1fffffff) & 7), uVar6 < 4)) {
                  uVar5 = uVar6;
                }
                peVar1 = (this->m_nodes).
                         super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[3].
                         super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr;
                if (uVar5 != 0) {
                  uVar6 = 0;
                  do {
                    pdVar4[uVar6] = *(double *)((long)&peVar1->field_0x38 + uVar6 * 8);
                    uVar6 = uVar6 + 1;
                  } while (uVar5 != uVar6);
                }
                if (uVar5 < 4) {
                  do {
                    pdVar4[uVar5] = *(double *)((long)&peVar1->field_0x38 + uVar5 * 8);
                    uVar5 = uVar5 + 1;
                  } while (uVar5 != 4);
                }
                return;
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChElementShellReissner4::GetStateBlock(ChVectorDynamic<>& mD) {
    mD.resize(4 * 7, 1);

    mD.segment(0, 3) = m_nodes[0]->GetPos().eigen();
    mD.segment(3, 4) = m_nodes[0]->GetRot().eigen();

    mD.segment(7, 3) = m_nodes[1]->GetPos().eigen();
    mD.segment(10, 4) = m_nodes[1]->GetRot().eigen();

    mD.segment(14, 3) = m_nodes[2]->GetPos().eigen();
    mD.segment(17, 4) = m_nodes[2]->GetRot().eigen();

    mD.segment(21, 3) = m_nodes[3]->GetPos().eigen();
    mD.segment(24, 4) = m_nodes[3]->GetRot().eigen();
}